

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

void __thiscall
DIntermissionScreen::Init(DIntermissionScreen *this,FIntermissionAction *desc,bool first)

{
  FIntermissionPatch *pFVar1;
  FIIntermissionPatch *pFVar2;
  bool bVar3;
  uint uVar4;
  FTextureID FVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  char *pcVar10;
  FName *pFVar11;
  undefined4 extraout_var;
  NameEntry *pNVar13;
  FString musicname;
  long lVar14;
  long lVar15;
  char *pp;
  FMemLump local_48;
  FSoundID local_34;
  uint *puVar12;
  
  if ((desc->mCdTrack == 0) || (bVar3 = S_ChangeCDMusic(desc->mCdTrack,desc->mCdId,true), !bVar3)) {
    musicname.Chars = (desc->mMusic).Chars;
    if (*(int *)(musicname.Chars + -0xc) == 0) {
      if (!first) goto LAB_0030062e;
      piVar8 = &gameinfo.finaleOrder;
      musicname.Chars = gameinfo.finaleMusic.Chars;
    }
    else {
      piVar8 = &desc->mMusicOrder;
    }
    S_ChangeMusic(musicname.Chars,*piVar8,desc->mMusicLooping,false);
  }
LAB_0030062e:
  *(int *)&(this->super_DObject).field_0x24 = desc->mDuration;
  pcVar10 = (desc->mBackground).Chars;
  if (*pcVar10 == '$') {
    pcVar10 = FStringTable::operator()(&GStrings,pcVar10 + 1);
    goto LAB_003006b5;
  }
  if (*pcVar10 != '@') goto LAB_003006b5;
  uVar9 = strtoul(pcVar10 + 1,(char **)&local_48,10);
  if ((*(byte *)local_48.Block.Chars == 0) &&
     (uVar4 = (int)uVar9 - 1, uVar4 < gameinfo.finalePages.Count)) {
    pFVar11 = gameinfo.finalePages.Array + uVar4;
LAB_003006a0:
    pNVar13 = FName::NameData.NameArray + pFVar11->Index;
  }
  else {
    pFVar11 = gameinfo.finalePages.Array;
    if (gameinfo.finalePages.Count != 0) goto LAB_003006a0;
    pNVar13 = (NameEntry *)&gameinfo.TitlePage;
  }
  pcVar10 = pNVar13->Text;
LAB_003006b5:
  if (*pcVar10 != '\0') {
    FVar5 = FTextureManager::CheckForTexture(&TexMan,pcVar10,8,1);
    (this->mBackground).texnum = FVar5.texnum;
    this->mFlatfill = desc->mFlatfill;
  }
  local_34.ID = S_FindSound((desc->mSound).Chars);
  S_Sound(0x22,&stack0xffffffffffffffcc,1.0,0.0);
  pcVar10 = (desc->mPalette).Chars;
  if ((*(int *)(pcVar10 + -0xc) != 0) &&
     (iVar6 = FWadCollection::CheckNumForFullName(&Wads,pcVar10,true,0), 0 < iVar6)) {
    FMemLump::FMemLump(&local_48);
    FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffc0,0x1c74350);
    FMemLump::operator=(&local_48,(FMemLump *)&stack0xffffffffffffffc0);
    FMemLump::~FMemLump((FMemLump *)&stack0xffffffffffffffc0);
    iVar6 = *(int *)((long)local_48.Block.Chars + -0xc);
    iVar7 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1a])();
    puVar12 = (uint *)CONCAT44(extraout_var,iVar7);
    if (iVar6 == 0) {
      local_48.Block.Chars = (FString)(FString)(byte *)0x0;
    }
    uVar4 = 0x101;
    do {
      *puVar12 = (uint)*(byte *)((long)local_48.Block.Chars + 1) << 8 |
                 (uint)*(byte *)local_48.Block.Chars << 0x10 |
                 (uint)*(byte *)((long)local_48.Block.Chars + 2);
      puVar12 = puVar12 + 1;
      local_48.Block.Chars = (FString)((long)local_48.Block.Chars + 3);
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1c])();
    this->mPaletteChanged = true;
    NoWipe = 1;
    M_EnableMenu(false);
    FMemLump::~FMemLump(&local_48);
  }
  TArray<FIIntermissionPatch,_FIIntermissionPatch>::Resize(&this->mOverlays,(desc->mOverlays).Count)
  ;
  if ((this->mOverlays).Count != 0) {
    lVar14 = 0x18;
    lVar15 = 0;
    uVar9 = 0;
    do {
      pFVar1 = (desc->mOverlays).Array;
      pFVar2 = (this->mOverlays).Array;
      *(undefined8 *)((long)&pFVar2->x + lVar15) = *(undefined8 *)((long)pFVar1 + lVar14 + -8);
      *(undefined8 *)((long)&pFVar2->y + lVar15) =
           *(undefined8 *)((long)&(pFVar1->mCondition).Index + lVar14);
      *(undefined4 *)((long)&(pFVar2->mCondition).Index + lVar15) =
           *(undefined4 *)((long)pFVar1 + lVar14 + -0x18);
      FVar5 = FTextureManager::CheckForTexture
                        (&TexMan,*(char **)((long)pFVar1 + lVar14 + -0x10),8,1);
      *(int *)((long)&(((this->mOverlays).Array)->mPic).texnum + lVar15) = FVar5.texnum;
      uVar9 = uVar9 + 1;
      lVar14 = lVar14 + 0x20;
      lVar15 = lVar15 + 0x18;
    } while (uVar9 < (this->mOverlays).Count);
  }
  this->mTicker = 0;
  return;
}

Assistant:

void DIntermissionScreen::Init(FIntermissionAction *desc, bool first)
{
	int lumpnum;

	if (desc->mCdTrack == 0 || !S_ChangeCDMusic (desc->mCdTrack, desc->mCdId))
	{
		if (desc->mMusic.IsEmpty())
		{
			// only start the default music if this is the first action in an intermission
			if (first) S_ChangeMusic (gameinfo.finaleMusic, gameinfo.finaleOrder, desc->mMusicLooping);
		}
		else
		{
			S_ChangeMusic (desc->mMusic, desc->mMusicOrder, desc->mMusicLooping);
		}
	}
	mDuration = desc->mDuration;

	const char *texname = desc->mBackground;
	if (*texname == '@')
	{
		char *pp;
		unsigned int v = strtoul(texname+1, &pp, 10) - 1;
		if (*pp == 0 && v < gameinfo.finalePages.Size())
		{
			texname = gameinfo.finalePages[v].GetChars();
		}
		else if (gameinfo.finalePages.Size() > 0)
		{
			texname = gameinfo.finalePages[0].GetChars();
		}
		else
		{
			texname = gameinfo.TitlePage.GetChars();
		}
	}
	else if (*texname == '$')
	{
		texname = GStrings(texname+1);
	}
	if (texname[0] != 0)
	{
		mBackground = TexMan.CheckForTexture(texname, FTexture::TEX_MiscPatch);
		mFlatfill = desc->mFlatfill;
	}
	S_Sound (CHAN_VOICE | CHAN_UI, desc->mSound, 1.0f, ATTN_NONE);
	if (desc->mPalette.IsNotEmpty() && (lumpnum = Wads.CheckNumForFullName(desc->mPalette, true)) > 0)
	{
		PalEntry *palette;
		const BYTE *orgpal;
		FMemLump lump;
		int i;

		lump = Wads.ReadLump (lumpnum);
		orgpal = (BYTE *)lump.GetMem();
		palette = screen->GetPalette ();
		for (i = 256; i > 0; i--, orgpal += 3)
		{
			*palette++ = PalEntry (orgpal[0], orgpal[1], orgpal[2]);
		}
		screen->UpdatePalette ();
		mPaletteChanged = true;
		NoWipe = 1;
		M_EnableMenu(false);
	}
	mOverlays.Resize(desc->mOverlays.Size());
	for (unsigned i=0; i < mOverlays.Size(); i++)
	{
		mOverlays[i].x = desc->mOverlays[i].x;
		mOverlays[i].y = desc->mOverlays[i].y;
		mOverlays[i].mCondition = desc->mOverlays[i].mCondition;
		mOverlays[i].mPic = TexMan.CheckForTexture(desc->mOverlays[i].mName, FTexture::TEX_MiscPatch);
	}
	mTicker = 0;
}